

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_AllgatherOne_Test::TestBody(MxxColl_AllgatherOne_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  comm *comm;
  pair<int,_double> pVar7;
  AssertHelper local_118;
  Message local_110;
  double local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  int i;
  Message local_b8;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  undefined1 local_78 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> pairs;
  int local_44;
  int local_40 [2];
  pair<int,_double> x;
  comm c;
  MxxColl_AllgatherOne_Test *this_local;
  
  mxx::comm::comm((comm *)&x.second);
  local_44 = mxx::comm::rank((comm *)&x.second);
  comm = (comm *)(ulong)(uint)(local_44 * 3);
  local_44 = local_44 * 0xd;
  iVar2 = mxx::comm::rank((comm *)&x.second);
  pairs.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)(3.141 / (double)iVar2);
  pVar7 = std::make_pair<int,double>
                    (&local_44,
                     (double *)
                     &pairs.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  x._0_8_ = pVar7.second;
  local_40[0] = pVar7.first;
  mxx::comm::comm((comm *)&gtest_ar.message_);
  mxx::allgather<std::pair<int,double>>
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_78,
             (mxx *)local_40,(pair<int,_double> *)&gtest_ar.message_,comm);
  mxx::comm::~comm((comm *)&gtest_ar.message_);
  local_ac = mxx::comm::size((comm *)&x.second);
  sVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     local_78);
  local_b0 = (int)sVar4;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_a8,"c.size()","(int)pairs.size()",&local_ac,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x1a0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_b8);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    for (gtest_ar_1.message_.ptr_._0_4_ = 0; iVar2 = (int)gtest_ar_1.message_.ptr_,
        iVar3 = mxx::comm::size((comm *)&x.second), iVar2 < iVar3;
        gtest_ar_1.message_.ptr_._0_4_ = (int)gtest_ar_1.message_.ptr_ + 1) {
      local_dc = (int)gtest_ar_1.message_.ptr_ * 0xd;
      pvVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)local_78,(long)(int)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_d8,"13*i","pairs[i].first",&local_dc,&pvVar6->first);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0x1a3,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_e8);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_001682af;
      local_108 = 3.141 / (double)(int)gtest_ar_1.message_.ptr_;
      pvVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)local_78,(long)(int)gtest_ar_1.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<double,double>
                ((EqHelper<false> *)local_100,"3.141/i","pairs[i].second",&local_108,&pvVar6->second
                );
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_110);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0x1a4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_118,&local_110);
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        testing::Message::~Message(&local_110);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (gtest_ar_1.message_.ptr_._4_4_ != 0) goto LAB_001682af;
    }
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
LAB_001682af:
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_78);
  mxx::comm::~comm((comm *)&x.second);
  return;
}

Assistant:

TEST(MxxColl, AllgatherOne) {
    mxx::comm c;
    std::pair<int,double> x = std::make_pair(13*c.rank(), 3.141/c.rank());
    // allgather
    std::vector<std::pair<int, double> > pairs = mxx::allgather(x);

    ASSERT_EQ(c.size(), (int)pairs.size());
    for (int i = 0; i < c.size(); ++i)
    {
        ASSERT_EQ(13*i, pairs[i].first);
        ASSERT_EQ(3.141/i, pairs[i].second);
    }
}